

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

SinkFinalizeType __thiscall
duckdb::PhysicalWindow::Finalize
          (PhysicalWindow *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  _Head_base<0UL,_duckdb::RowDataCollection_*,_false> _Var1;
  bool bVar2;
  pointer pWVar3;
  pointer pRVar4;
  type __args;
  mutex *this_00;
  bool bVar5;
  shared_ptr<duckdb::PartitionMergeEvent,_true> new_event;
  undefined1 local_69;
  shared_ptr<duckdb::PartitionMergeEvent,_true> local_68;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::PartitionMergeEvent> local_40;
  
  this_00 = &input->global_state[1].super_StateWithBlockableTasks.lock;
  pWVar3 = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
                         *)this_00);
  bVar5 = true;
  if ((pWVar3->super_PartitionGlobalSinkState).count.super___atomic_base<unsigned_long>._M_i != 0) {
    pWVar3 = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
             ::operator->((unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
                           *)this_00);
    _Var1._M_head_impl =
         (pWVar3->super_PartitionGlobalSinkState).rows.
         super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
         .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl;
    pWVar3 = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
             ::operator->((unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
                           *)this_00);
    if (_Var1._M_head_impl == (RowDataCollection *)0x0) {
      bVar2 = PartitionGlobalSinkState::HasMergeTasks(&pWVar3->super_PartitionGlobalSinkState);
      if (bVar2) {
        __args = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
                 ::operator*((unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
                              *)this_00);
        local_40.super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<duckdb::PartitionMergeEvent,std::allocator<duckdb::PartitionMergeEvent>,duckdb::WindowPartitionGlobalSinkState&,duckdb::Pipeline&,duckdb::PhysicalWindow_const&>
                  (&local_40.
                    super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(PartitionMergeEvent **)&local_40,
                   (allocator<duckdb::PartitionMergeEvent> *)&local_69,__args,pipeline,this);
        shared_ptr<duckdb::PartitionMergeEvent,_true>::shared_ptr(&local_68,&local_40);
        if (local_40.super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.
                     super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             local_68.internal.
             super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_68.internal.
                super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        local_68.internal.
        super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.internal.
        super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Event::InsertEvent(event,&local_58);
        if (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_68.internal.
            super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.internal.
                     super___shared_ptr<duckdb::PartitionMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        bVar5 = false;
      }
    }
    else {
      pRVar4 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
               ::operator->(&(pWVar3->super_PartitionGlobalSinkState).rows);
      bVar5 = pRVar4->count == 0;
    }
  }
  return bVar5;
}

Assistant:

SinkFinalizeType PhysicalWindow::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                          OperatorSinkFinalizeInput &input) const {
	auto &state = input.global_state.Cast<WindowGlobalSinkState>();

	//	Did we get any data?
	if (!state.global_partition->count) {
		return SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}

	// Do we have any sorting to schedule?
	if (state.global_partition->rows) {
		D_ASSERT(!state.global_partition->grouping_data);
		return state.global_partition->rows->count ? SinkFinalizeType::READY : SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}

	// Find the first group to sort
	if (!state.global_partition->HasMergeTasks()) {
		// Empty input!
		return SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}

	// Schedule all the sorts for maximum thread utilisation
	auto new_event = make_shared_ptr<PartitionMergeEvent>(*state.global_partition, pipeline, *this);
	event.InsertEvent(std::move(new_event));

	return SinkFinalizeType::READY;
}